

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  size_t sVar2;
  long in_RDI;
  size_t cSize;
  size_t endResult;
  size_t in_stack_00000058;
  undefined4 in_stack_00000060;
  U32 in_stack_00000064;
  ZSTD_CCtx *in_stack_00000068;
  void *in_stack_00000070;
  size_t in_stack_00000078;
  void *in_stack_00000080;
  ZSTD_CCtx *in_stack_00000088;
  U32 in_stack_000000a0;
  size_t local_8;
  
  sVar2 = ZSTD_compressContinue_internal
                    (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070,
                     (size_t)in_stack_00000068,in_stack_00000064,in_stack_000000a0);
  uVar1 = ZSTD_isError(0x28b667);
  local_8 = sVar2;
  if (uVar1 == 0) {
    local_8 = ZSTD_writeEpilogue(in_stack_00000068,
                                 (void *)CONCAT44(in_stack_00000064,in_stack_00000060),
                                 in_stack_00000058);
    uVar1 = ZSTD_isError(0x28b6a8);
    if (uVar1 == 0) {
      if ((*(long *)(in_RDI + 0x120) == 0) ||
         (*(long *)(in_RDI + 0x120) == *(long *)(in_RDI + 0x128) + 1)) {
        local_8 = sVar2 + local_8;
      }
      else {
        local_8 = 0xffffffffffffffb8;
      }
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    if (ZSTD_isError(cSize)) return cSize;
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    if (ZSTD_isError(endResult)) return endResult;
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        if (cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1) {
            DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize = %u",
                (U32)cctx->pledgedSrcSizePlusOne-1, (U32)cctx->consumedSrcSize);
            return ERROR(srcSize_wrong);
    }   }
    return cSize + endResult;
}